

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# array.h
# Opt level: O0

void __thiscall
kj::Array<capnp::Orphan<capnp::compiler::Declaration>_>::~Array
          (Array<capnp::Orphan<capnp::compiler::Declaration>_> *this)

{
  Array<capnp::Orphan<capnp::compiler::Declaration>_> *this_local;
  
  dispose(this);
  return;
}

Assistant:

inline ~Array() noexcept { dispose(); }